

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffchdu(fitsfile *fptr,int *status)

{
  long lVar1;
  long lVar2;
  int local_80;
  int ntilebins;
  int stdriver;
  int ii;
  char message [81];
  int *status_local;
  fitsfile *fptr_local;
  
  if (fptr->HDUposition == fptr->Fptr->curhdu) {
    if (fptr->Fptr->writemode == 1) {
      urltype2driver("stream://",&local_80);
      if (fptr->Fptr->driver != local_80) {
        ffrdef(fptr,status);
      }
      if (0 < fptr->Fptr->heapsize) {
        ffuptf(fptr,status);
      }
      ffpdfl(fptr,status);
    }
  }
  else {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  if ((fptr->Fptr->open_count == 1) && (fptr->Fptr->tableptr != (tcolumn *)0x0)) {
    free(fptr->Fptr->tableptr);
    fptr->Fptr->tableptr = (tcolumn *)0x0;
    if (fptr->Fptr->tilerow != (int *)0x0) {
      lVar1 = fptr->Fptr->znaxis[0];
      lVar2 = fptr->Fptr->tilesize[0];
      for (ntilebins = 0; ntilebins < (int)((lVar1 + -1) / lVar2) + 1; ntilebins = ntilebins + 1) {
        if (fptr->Fptr->tiledata[ntilebins] != (void *)0x0) {
          free(fptr->Fptr->tiledata[ntilebins]);
        }
        if (fptr->Fptr->tilenullarray[ntilebins] != (void *)0x0) {
          free(fptr->Fptr->tilenullarray[ntilebins]);
        }
      }
      free(fptr->Fptr->tileanynull);
      free(fptr->Fptr->tiletype);
      free(fptr->Fptr->tiledatasize);
      free(fptr->Fptr->tilenullarray);
      free(fptr->Fptr->tiledata);
      free(fptr->Fptr->tilerow);
      fptr->Fptr->tileanynull = (int *)0x0;
      fptr->Fptr->tiletype = (int *)0x0;
      fptr->Fptr->tiledatasize = (long *)0x0;
      fptr->Fptr->tilenullarray = (void **)0x0;
      fptr->Fptr->tiledata = (void **)0x0;
      fptr->Fptr->tilerow = (int *)0x0;
    }
  }
  if ((0 < *status) && (*status != 999)) {
    snprintf((char *)&stdriver,0x51,"Error while closing HDU number %d (ffchdu).",
             (ulong)(uint)fptr->Fptr->curhdu);
    ffpmsg((char *)&stdriver);
  }
  return *status;
}

Assistant:

int ffchdu(fitsfile *fptr,      /* I - FITS file pointer */
           int *status)         /* IO - error status     */
{
/*
  close the current HDU.  If we have write access to the file, then:
    - write the END keyword and pad header with blanks if necessary
    - check the data fill values, and rewrite them if not correct
*/
    char message[FLEN_ERRMSG];
    int ii, stdriver, ntilebins;

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
    {
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
        /* no need to do any further updating of the HDU */
    }
    else if ((fptr->Fptr)->writemode == 1)
    {
        urltype2driver("stream://", &stdriver);

        /* don't rescan header in special case of writing to stdout */
        if (((fptr->Fptr)->driver != stdriver)) 
             ffrdef(fptr, status); 

        if ((fptr->Fptr)->heapsize > 0) {
          ffuptf(fptr, status);  /* update the variable length TFORM values */
        }
	
        ffpdfl(fptr, status);  /* insure correct data fill values */
    }

    if ((fptr->Fptr)->open_count == 1)
    {

    /* free memory for the CHDU structure only if no other files are using it */
        if ((fptr->Fptr)->tableptr)
        {
            free((fptr->Fptr)->tableptr);
           (fptr->Fptr)->tableptr = NULL;

          /* free the tile-compressed image cache, if it exists */
          if ((fptr->Fptr)->tilerow) {

           ntilebins = 
	    (((fptr->Fptr)->znaxis[0] - 1) / ((fptr->Fptr)->tilesize[0])) + 1;

           for (ii = 0; ii < ntilebins; ii++) {
             if ((fptr->Fptr)->tiledata[ii]) {
	       free((fptr->Fptr)->tiledata[ii]);
             }

             if ((fptr->Fptr)->tilenullarray[ii]) {
	       free((fptr->Fptr)->tilenullarray[ii]);
             }
            }
	    
	    free((fptr->Fptr)->tileanynull);
	    free((fptr->Fptr)->tiletype);	   
	    free((fptr->Fptr)->tiledatasize);
	    free((fptr->Fptr)->tilenullarray);
	    free((fptr->Fptr)->tiledata);
	    free((fptr->Fptr)->tilerow);

	    (fptr->Fptr)->tileanynull = 0;
	    (fptr->Fptr)->tiletype = 0;	   
	    (fptr->Fptr)->tiledatasize = 0;
	    (fptr->Fptr)->tilenullarray = 0;
	    (fptr->Fptr)->tiledata = 0;
	    (fptr->Fptr)->tilerow = 0;
          }
        }
    }

    if (*status > 0 && *status != NO_CLOSE_ERROR)
    {
        snprintf(message,FLEN_ERRMSG,
        "Error while closing HDU number %d (ffchdu).", (fptr->Fptr)->curhdu);
        ffpmsg(message);
    }
    return(*status);
}